

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastTimer.cpp
# Opt level: O2

void __thiscall FastTimer::timerEvent(FastTimer *this,QTimerEvent *evt)

{
  int iVar1;
  CallbackFn UNRECOVERED_JUMPTABLE;
  void *pvVar2;
  
  QBasicMutex::lock(&(this->mMutex).super_QBasicMutex);
  iVar1 = this->mTimerId;
  UNRECOVERED_JUMPTABLE = this->mCallback;
  pvVar2 = this->mCallbackData;
  QBasicMutex::unlock(&(this->mMutex).super_QBasicMutex);
  if (UNRECOVERED_JUMPTABLE != (CallbackFn)0x0 && *(int *)(evt + 0x10) == iVar1) {
    (*UNRECOVERED_JUMPTABLE)(pvVar2);
    return;
  }
  return;
}

Assistant:

void FastTimer::timerEvent(QTimerEvent *evt) {
    mMutex.lock();
    auto const timerId = mTimerId;
    auto const callback = mCallback;
    auto const data = mCallbackData;
    mMutex.unlock();


    if (evt->timerId() == timerId && callback) {
        callback(data);
    }

}